

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

uint __thiscall Kernel::Signature::getArrowConstructor(Signature *this)

{
  Symbol *this_00;
  uint uVar1;
  TermList TVar2;
  OperatorKey *key;
  OperatorType *type;
  size_type extraout_RDX;
  initializer_list<Kernel::TermList> sorts;
  bool added;
  bool local_41;
  string local_40;
  
  local_41 = false;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sTfun","");
  uVar1 = addTypeCon(this,&local_40,2,&local_41);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_41 == true) {
    this->_arrowCon = uVar1;
    TVar2 = AtomicSort::superSort();
    this_00 = (this->_typeCons)._stack[uVar1];
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x2;
    local_40._M_dataplus._M_p = (pointer)TVar2;
    local_40._M_string_length = (size_type)TVar2;
    key = OperatorType::setupKey((OperatorType *)&local_40,sorts);
    *(uint64_t *)(key + 0x18) = TVar2._content;
    type = OperatorType::getTypeFromKey(key,0);
    Symbol::setType(this_00,type);
  }
  return uVar1;
}

Assistant:

unsigned getArrowConstructor(){
    bool added = false;
    unsigned arrow = addTypeCon("sTfun",2, added);
    if(added){
      _arrowCon = arrow;
      TermList ss = AtomicSort::superSort();
      Symbol* arr = getTypeCon(arrow);
      arr->setType(OperatorType::getFunctionType({ss, ss}, ss));
    }
    return arrow;    
  }